

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O0

void xmlRegexpErrCompile(xmlRegParserCtxtPtr ctxt,char *extra)

{
  int local_34;
  xmlChar *pxStack_30;
  int idx;
  char *regexp;
  char *extra_local;
  xmlRegParserCtxtPtr ctxt_local;
  
  pxStack_30 = (xmlChar *)0x0;
  local_34 = 0;
  if (ctxt != (xmlRegParserCtxtPtr)0x0) {
    pxStack_30 = ctxt->string;
    local_34 = (int)ctxt->cur - (int)ctxt->string;
    ctxt->error = 0x5aa;
  }
  __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,(void *)0x0,
                  (void *)0x0,0xe,0x5aa,XML_ERR_FATAL,(char *)0x0,0,extra,(char *)pxStack_30,
                  (char *)0x0,local_34,0,"failed to compile: %s\n",extra);
  return;
}

Assistant:

static void
xmlRegexpErrCompile(xmlRegParserCtxtPtr ctxt, const char *extra)
{
    const char *regexp = NULL;
    int idx = 0;

    if (ctxt != NULL) {
        regexp = (const char *) ctxt->string;
	idx = ctxt->cur - ctxt->string;
	ctxt->error = XML_REGEXP_COMPILE_ERROR;
    }
    __xmlRaiseError(NULL, NULL, NULL, NULL, NULL, XML_FROM_REGEXP,
		    XML_REGEXP_COMPILE_ERROR, XML_ERR_FATAL, NULL, 0, extra,
		    regexp, NULL, idx, 0,
		    "failed to compile: %s\n", extra);
}